

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string_view name)

{
  Mutex *this_00;
  DescriptorPool *pool_00;
  bool bVar1;
  Symbol SVar2;
  Symbol unaff_RBP;
  SymbolBase *pSVar3;
  bool bVar4;
  MutexLockMaybe lock_1;
  DeferredValidation deferred_validation;
  MutexLockMaybe MStack_318;
  DeferredValidation local_310;
  
  this_00 = pool->mutex_;
  if (this_00 != (Mutex *)0x0) {
    local_310.initial_buffer_._0_8_ = this_00;
    absl::lts_20250127::Mutex::ReaderLock(this_00);
    bVar1 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->known_bad_symbols_).
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
    bVar4 = true;
    if ((bVar1) &&
       (bVar1 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&(this->known_bad_files_).
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ), bVar1)) {
      unaff_RBP = FindSymbol(this,name);
      bVar4 = (unaff_RBP.ptr_)->symbol_type_ == '\0';
    }
    absl::lts_20250127::ReaderMutexLock::~ReaderMutexLock((ReaderMutexLock *)&local_310);
    if (!bVar4) {
      return (Symbol)unaff_RBP.ptr_;
    }
  }
  DeferredValidation::DeferredValidation(&local_310,pool);
  absl::lts_20250127::MutexLockMaybe::MutexLockMaybe(&MStack_318,pool->mutex_);
  if (pool->fallback_database_ != (DescriptorDatabase *)0x0) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->known_bad_symbols_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->known_bad_files_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  }
  SVar2 = FindSymbol(this,name);
  if (((SVar2.ptr_)->symbol_type_ == '\0') &&
     (((pool_00 = pool->underlay_, pool_00 == (DescriptorPool *)0x0 ||
       (SVar2 = FindByNameHelper((pool_00->tables_)._M_t.
                                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                 ._M_head_impl,pool_00,name), (SVar2.ptr_)->symbol_type_ == '\0'))
      && (bVar4 = TryFindSymbolInFallbackDatabase(pool,name,&local_310), bVar4)))) {
    SVar2 = FindSymbol(this,name);
  }
  absl::lts_20250127::MutexLockMaybe::~MutexLockMaybe(&MStack_318);
  bVar4 = DeferredValidation::Validate(&local_310);
  pSVar3 = (SymbolBase *)&Symbol::Symbol()::null_symbol;
  if (bVar4) {
    pSVar3 = SVar2.ptr_;
  }
  DeferredValidation::~DeferredValidation(&local_310);
  return (Symbol)pSVar3;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                absl::string_view name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    absl::ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  DescriptorPool::DeferredValidation deferred_validation(pool);
  Symbol result;
  {
    absl::MutexLockMaybe lock(pool->mutex_);
    if (pool->fallback_database_ != nullptr) {
      known_bad_symbols_.clear();
      known_bad_files_.clear();
    }
    result = FindSymbol(name);

    if (result.IsNull() && pool->underlay_ != nullptr) {
      // Symbol not found; check the underlay.
      result =
          pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
    }

    if (result.IsNull()) {
      // Symbol still not found, so check fallback database.
      if (pool->TryFindSymbolInFallbackDatabase(name, deferred_validation)) {
        result = FindSymbol(name);
      }
    }
  }

  if (!deferred_validation.Validate()) {
    return Symbol();
  }
  return result;
}